

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int saveAllCursors(BtShared *pBt,Pgno iRoot,BtCursor *pExcept)

{
  int iVar1;
  
  do {
    pBt = (BtShared *)((BtCursor *)pBt)->pNext;
    if ((BtCursor *)pBt == (BtCursor *)0x0) {
      return 0;
    }
  } while (((BtCursor *)pBt == pExcept) || ((iRoot != 0 && (((BtCursor *)pBt)->pgnoRoot != iRoot))))
  ;
  do {
    if (((BtCursor *)pBt != pExcept) && ((iRoot == 0 || (((BtCursor *)pBt)->pgnoRoot == iRoot)))) {
      if ((byte)(((BtCursor *)pBt)->eState - 1) < 2) {
        iVar1 = saveCursorPosition((BtCursor *)pBt);
        if (iVar1 != 0) {
          return iVar1;
        }
      }
      else {
        btreeReleaseAllCursorPages((BtCursor *)pBt);
      }
    }
    pBt = (BtShared *)((BtCursor *)pBt)->pNext;
  } while ((BtCursor *)pBt != (BtCursor *)0x0);
  return 0;
}

Assistant:

static int saveAllCursors(BtShared *pBt, Pgno iRoot, BtCursor *pExcept){
  BtCursor *p;
  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( pExcept==0 || pExcept->pBt==pBt );
  for(p=pBt->pCursor; p; p=p->pNext){
    if( p!=pExcept && (0==iRoot || p->pgnoRoot==iRoot) ) break;
  }
  return p ? saveCursorsOnList(p, iRoot, pExcept) : SQLITE_OK;
}